

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planner.cpp
# Opt level: O2

void __thiscall
despot::Planner::Planner
          (Planner *this,string *lower_bounds_str,string *base_lower_bounds_str,
          string *upper_bounds_str,string *base_upper_bounds_str)

{
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,(string *)lower_bounds_str);
  std::__cxx11::string::string((string *)&local_60,(string *)base_lower_bounds_str);
  std::__cxx11::string::string((string *)&local_80,(string *)upper_bounds_str);
  std::__cxx11::string::string((string *)&local_a0,(string *)base_upper_bounds_str);
  PlannerBase::PlannerBase(&this->super_PlannerBase,&local_40,&local_60,&local_80,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  (this->super_PlannerBase)._vptr_PlannerBase = (_func_int **)&PTR__Planner_0019b760;
  this->step_ = 0;
  this->round_ = 0;
  return;
}

Assistant:

Planner::Planner(string lower_bounds_str,
		string base_lower_bounds_str, string upper_bounds_str, string base_upper_bounds_str)
		:PlannerBase(lower_bounds_str, base_lower_bounds_str, upper_bounds_str, base_upper_bounds_str){
	step_=0;
	round_=0;
}